

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Vec_Int_t * Abc_NtkGetLatchValues(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Int_t *p;
  Abc_Obj_t *pLatch;
  int i;
  int Entry;
  
  p = Vec_IntAlloc(pNtk->nObjCounts[8]);
  i = 0;
  do {
    if (pNtk->vBoxes->nSize <= i) {
      return p;
    }
    pLatch = Abc_NtkBox(pNtk,i);
    if ((*(uint *)&pLatch->field_0x14 & 0xf) == 8) {
      if ((pLatch->field_5).pData == (void *)0x1) {
        Entry = 0;
      }
      else {
        iVar1 = Abc_LatchIsInit1(pLatch);
        Entry = 1;
        if (iVar1 == 0) {
          iVar1 = Abc_LatchIsInitDc(pLatch);
          Entry = 2;
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                          ,0x559,"Vec_Int_t *Abc_NtkGetLatchValues(Abc_Ntk_t *)");
          }
        }
      }
      Vec_IntPush(p,Entry);
    }
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Abc_NtkGetLatchValues( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vInits;
    Abc_Obj_t * pLatch;
    int i;
    vInits = Vec_IntAlloc( Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        if ( Abc_LatchIsInit0(pLatch) )
            Vec_IntPush( vInits, 0 );
        else if ( Abc_LatchIsInit1(pLatch) )
            Vec_IntPush( vInits, 1 );
        else if ( Abc_LatchIsInitDc(pLatch) )
            Vec_IntPush( vInits, 2 );
        else
            assert( 0 );
    }
    return vInits;
}